

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O2

void test_evp_enum(void)

{
  reference_type pDVar1;
  compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>_> local_10;
  compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>_> local_c;
  opt_dir oN;
  opt_dir oW;
  
  local_10.super_type.value_ = (type)0;
  local_c.super_type.value_ = (type)3;
  pDVar1 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>_>::value
                     (&local_10);
  if (*pDVar1 != N) {
    __assert_fail("oN.value() == Dir::N",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x14a,"void test_evp_enum()");
  }
  pDVar1 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>_>::value
                     (&local_c);
  if (*pDVar1 != W) {
    __assert_fail("oW.value() == Dir::W",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x14b,"void test_evp_enum()");
  }
  if (local_10.super_type.value_ != 0) {
    __assert_fail("oN.unsafe_raw_value() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x14e,"void test_evp_enum()");
  }
  if (local_c.super_type.value_ == 3) {
    return;
  }
  __assert_fail("oW.unsafe_raw_value() == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,0x14f,"void test_evp_enum()");
}

Assistant:

void test_evp_enum()
{
  typedef compact_optional<evp_enum<Dir, -1>> opt_dir;
  opt_dir o_, oN(Dir::N), oW(Dir::W);
  
  assert (!o_.has_value());
  assert ( oN.has_value());
  assert ( oW.has_value());
  
  assert (oN.value() == Dir::N);
  assert (oW.value() == Dir::W);
  
  assert (o_.unsafe_raw_value() == -1);
  assert (oN.unsafe_raw_value() ==  0);
  assert (oW.unsafe_raw_value() ==  3);
}